

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mesh_shading.cpp
# Opt level: O2

spv_result_t spvtools::val::MeshShadingPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint id;
  StorageClass SVar4;
  Function *pFVar5;
  Instruction *this;
  char *pcVar6;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  DiagnosticStream local_1f8;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 == 0x14af) {
    pFVar5 = ValidationState_t::function(_,inst->function_->id_);
    local_238._M_unused._M_object = (void *)0x0;
    local_238._8_8_ = 0;
    local_220 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_mesh_shading.cpp:82:15)>
                ::_M_invoke;
    local_228 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_mesh_shading.cpp:82:15)>
                ::_M_manager;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar5->execution_model_limitations_,(value_type *)&local_238);
    if (local_228 != (code *)0x0) {
      (*local_228)(&local_238,&local_238,__destroy_functor);
    }
    uVar3 = ValidationState_t::GetOperandTypeId(_,inst,0);
    bVar2 = ValidationState_t::IsUnsignedIntScalarType(_,uVar3);
    if ((bVar2) && (uVar3 = ValidationState_t::GetBitWidth(_,uVar3), uVar3 == 0x20)) {
      uVar3 = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar2 = ValidationState_t::IsUnsignedIntScalarType(_,uVar3);
      if ((bVar2) && (uVar3 = ValidationState_t::GetBitWidth(_,uVar3), uVar3 == 0x20)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar6 = "Primitive Count must be a 32-bit unsigned int scalar";
    }
    else {
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar6 = "Vertex Count must be a 32-bit unsigned int scalar";
    }
  }
  else {
    if (uVar1 != 0x14ae) {
      return SPV_SUCCESS;
    }
    pFVar5 = ValidationState_t::function(_,inst->function_->id_);
    local_218._M_unused._M_object = (void *)0x0;
    local_218._8_8_ = 0;
    local_200 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_mesh_shading.cpp:31:15)>
                ::_M_invoke;
    local_208 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_mesh_shading.cpp:31:15)>
                ::_M_manager;
    std::__cxx11::
    list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar5->execution_model_limitations_,(value_type *)&local_218);
    if (local_208 != (code *)0x0) {
      (*local_208)(&local_218,&local_218,__destroy_functor);
    }
    uVar3 = ValidationState_t::GetOperandTypeId(_,inst,0);
    bVar2 = ValidationState_t::IsUnsignedIntScalarType(_,uVar3);
    if ((bVar2) && (uVar3 = ValidationState_t::GetBitWidth(_,uVar3), uVar3 == 0x20)) {
      uVar3 = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar2 = ValidationState_t::IsUnsignedIntScalarType(_,uVar3);
      if ((bVar2) && (uVar3 = ValidationState_t::GetBitWidth(_,uVar3), uVar3 == 0x20)) {
        uVar3 = ValidationState_t::GetOperandTypeId(_,inst,2);
        bVar2 = ValidationState_t::IsUnsignedIntScalarType(_,uVar3);
        if ((bVar2) && (uVar3 = ValidationState_t::GetBitWidth(_,uVar3), uVar3 == 0x20)) {
          if ((long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0x40) {
            return SPV_SUCCESS;
          }
          id = Instruction::GetOperandAs<unsigned_int>(inst,3);
          this = ValidationState_t::FindDef(_,id);
          if ((this->inst_).opcode == 0x3b) {
            SVar4 = Instruction::GetOperandAs<spv::StorageClass>(this,2);
            if (SVar4 == TaskPayloadWorkgroupEXT) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar6 = "Payload OpVariable must have a storage class of TaskPayloadWorkgroupEXT";
          }
          else {
            ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar6 = "Payload must be the result of a OpVariable";
          }
        }
        else {
          ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar6 = "Group Count Z must be a 32-bit unsigned int scalar";
        }
      }
      else {
        ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar6 = "Group Count Y must be a 32-bit unsigned int scalar";
      }
    }
    else {
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar6 = "Group Count X must be a 32-bit unsigned int scalar";
    }
  }
  std::operator<<((ostream *)&local_1f8,pcVar6);
  DiagnosticStream::~DiagnosticStream(&local_1f8);
  return local_1f8.error_;
}

Assistant:

spv_result_t MeshShadingPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpEmitMeshTasksEXT: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::TaskEXT) {
                  if (message) {
                    *message =
                        "OpEmitMeshTasksEXT requires TaskEXT execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t group_count_x = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(group_count_x) ||
          _.GetBitWidth(group_count_x) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count X must be a 32-bit unsigned int scalar";
      }

      const uint32_t group_count_y = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(group_count_y) ||
          _.GetBitWidth(group_count_y) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count Y must be a 32-bit unsigned int scalar";
      }

      const uint32_t group_count_z = _.GetOperandTypeId(inst, 2);
      if (!_.IsUnsignedIntScalarType(group_count_z) ||
          _.GetBitWidth(group_count_z) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Group Count Z must be a 32-bit unsigned int scalar";
      }

      if (inst->operands().size() == 4) {
        const auto payload = _.FindDef(inst->GetOperandAs<uint32_t>(3));
        if (payload->opcode() != spv::Op::OpVariable) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Payload must be the result of a OpVariable";
        }
        if (payload->GetOperandAs<spv::StorageClass>(2) !=
            spv::StorageClass::TaskPayloadWorkgroupEXT) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Payload OpVariable must have a storage class of "
                    "TaskPayloadWorkgroupEXT";
        }
      }
      break;
    }

    case spv::Op::OpSetMeshOutputsEXT: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::MeshEXT) {
                  if (message) {
                    *message =
                        "OpSetMeshOutputsEXT requires MeshEXT execution model";
                  }
                  return false;
                }
                return true;
              });

      const uint32_t vertex_count = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(vertex_count) ||
          _.GetBitWidth(vertex_count) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Vertex Count must be a 32-bit unsigned int scalar";
      }

      const uint32_t primitive_count = _.GetOperandTypeId(inst, 1);
      if (!_.IsUnsignedIntScalarType(primitive_count) ||
          _.GetBitWidth(primitive_count) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Primitive Count must be a 32-bit unsigned int scalar";
      }

      break;
    }

    case spv::Op::OpWritePackedPrimitiveIndices4x8NV: {
      // No validation rules (for the moment).
      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}